

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcCrossProductsPartials
          (BeagleCPUImpl<double,_1,_0> *this,double *postOrderPartial,double *preOrderPartial,
          double *categoryRates,double *categoryWeights,double edgeLength,double *outCrossProducts,
          double *outSumSquaredDerivatives)

{
  double dVar1;
  double dVar2;
  int iVar3;
  vector<double,_std::allocator<double>_> *this_00;
  reference pvVar4;
  long in_RCX;
  long lVar5;
  long in_RDX;
  long in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  long in_R8;
  long in_R9;
  double in_XMM0_Qa;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int j_1;
  int k_2;
  double patternWeight;
  int j;
  int k_1;
  int k;
  double denominator;
  int v;
  int patternIndex;
  double weight;
  double scale;
  int category;
  double patternDenominator;
  vector<double,_std::allocator<double>_> tmp;
  int pattern;
  allocator_type *in_stack_ffffffffffffff18;
  undefined1 *__n;
  int local_c8;
  int local_c4;
  int local_b4;
  int local_b0;
  int local_ac;
  ulong local_a8;
  int local_84;
  double local_80;
  undefined1 local_61;
  undefined8 local_60;
  vector<double,_std::allocator<double>_> local_58;
  int local_3c;
  long local_38;
  double local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_38 = in_R9;
  local_30 = in_XMM0_Qa;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_3c = 0;
      local_3c <
      *(int *)((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 4); local_3c = local_3c + 1) {
    iVar3 = *(int *)((long)&in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish + 4);
    this_00 = (vector<double,_std::allocator<double>_> *)(ulong)(uint)(iVar3 * iVar3);
    local_60 = 0;
    __n = &local_61;
    std::allocator<double>::allocator((allocator<double> *)0x179f53);
    std::vector<double,_std::allocator<double>_>::vector
              (in_RDI,(size_type)__n,(value_type *)this_00,in_stack_ffffffffffffff18);
    std::allocator<double>::~allocator((allocator<double> *)0x179f81);
    local_80 = 0.0;
    for (local_84 = 0;
        local_84 <
        *(int *)((long)&in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + 4); local_84 = local_84 + 1) {
      dVar2 = *(double *)(local_20 + (long)local_84 * 8) * local_30;
      dVar1 = *(double *)(local_28 + (long)local_84 * 8);
      iVar3 = (local_84 *
               *(int *)((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                               .super__Vector_impl_data._M_end_of_storage + 4) + local_3c) *
              *(int *)((long)&in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 4);
      local_a8 = 0;
      for (local_ac = 0;
          local_ac <
          *(int *)((long)&in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish + 4); local_ac = local_ac + 1) {
        auVar10._8_8_ = 0;
        auVar10._0_8_ = *(ulong *)(local_10 + (long)(iVar3 + local_ac) * 8);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = *(ulong *)(local_18 + (long)(iVar3 + local_ac) * 8);
        auVar14._8_8_ = 0;
        auVar14._0_8_ = local_a8;
        auVar9 = vfmadd213sd_fma(auVar6,auVar10,auVar14);
        local_a8 = auVar9._0_8_;
      }
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_a8;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = dVar1;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_80;
      auVar9 = vfmadd213sd_fma(auVar7,auVar11,auVar15);
      local_80 = auVar9._0_8_;
      for (local_b0 = 0;
          local_b0 <
          *(int *)((long)&in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish + 4); local_b0 = local_b0 + 1) {
        for (local_b4 = 0;
            local_b4 <
            *(int *)((long)&in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish + 4); local_b4 = local_b4 + 1) {
          in_stack_ffffffffffffff18 =
               (allocator_type *)
               (*(double *)(local_18 + (long)(iVar3 + local_b0) * 8) *
                *(double *)(local_10 + (long)(iVar3 + local_b4) * 8) * dVar1);
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_58,
                              (long)(local_b0 *
                                     *(int *)((long)&in_RDI[1].
                                                                                                          
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish + 4) +
                                    local_b4));
          auVar8._8_8_ = 0;
          auVar8._0_8_ = dVar2;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = in_stack_ffffffffffffff18;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = *pvVar4;
          auVar9 = vfmadd213sd_fma(auVar8,auVar12,auVar16);
          *pvVar4 = auVar9._0_8_;
        }
      }
    }
    auVar9._0_8_ = in_RDI[5].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish[local_3c] / local_80;
    for (local_c4 = 0;
        local_c4 <
        *(int *)((long)&in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish + 4); local_c4 = local_c4 + 1) {
      for (local_c8 = 0;
          local_c8 <
          *(int *)((long)&in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish + 4); local_c8 = local_c8 + 1) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_58,
                            (long)(local_c4 *
                                   *(int *)((long)&in_RDI[1].
                                                                                                      
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish + 4) +
                                  local_c8));
        auVar13._8_8_ = 0;
        auVar13._0_8_ = *pvVar4;
        auVar9._8_8_ = 0;
        lVar5 = (long)(local_c4 *
                       *(int *)((long)&in_RDI[1].super__Vector_base<double,_std::allocator<double>_>
                                       ._M_impl.super__Vector_impl_data._M_finish + 4) + local_c8);
        auVar17._8_8_ = 0;
        auVar17._0_8_ = *(ulong *)(local_38 + lVar5 * 8);
        auVar13 = vfmadd213sd_fma(auVar9,auVar13,auVar17);
        *(long *)(local_38 + lVar5 * 8) = auVar13._0_8_;
      }
    }
    std::vector<double,_std::allocator<double>_>::~vector(this_00);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcCrossProductsPartials(const REALTYPE *postOrderPartial,
                                                                  const REALTYPE *preOrderPartial,
                                                                  const double *categoryRates,
                                                                  const REALTYPE *categoryWeights,
                                                                  const double edgeLength,
                                                                  double *outCrossProducts,
                                                                  double *outSumSquaredDerivatives) {

    for (int pattern = 0; pattern < kPatternCount; pattern++) {

        std::vector<REALTYPE> tmp(kStateCount * kStateCount, 0.0); // TODO Handle temporary memory better

        REALTYPE patternDenominator = 0.0;

        for (int category = 0; category < kCategoryCount; category++) {

            const REALTYPE scale = (REALTYPE) categoryRates[category] * edgeLength;

            const REALTYPE weight = categoryWeights[category];
            const int patternIndex = category * kPatternCount + pattern; // Bad memory access
            const int v = patternIndex * kPartialsPaddedStateCount;

            REALTYPE denominator = 0.0;
            for (int k = 0; k < kStateCount; k++) {
                denominator += postOrderPartial[v + k] * preOrderPartial[v + k];
            }
            patternDenominator += denominator * weight;

            for (int k = 0; k < kStateCount; k++) {
                for (int j = 0; j < kStateCount; j++) {
                    tmp[k * kStateCount + j] += preOrderPartial[v + k] * postOrderPartial[v + j] * weight * scale;
                }
            }
        }

        const auto patternWeight = gPatternWeights[pattern] / patternDenominator;
        for (int k = 0; k < kStateCount; k++) {
            for (int j = 0; j < kStateCount; j++) {
                outCrossProducts[k * kStateCount + j] += tmp[k * kStateCount + j] * patternWeight;
            }
        }
    }
}